

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic128.h
# Opt level: O0

Int128 * atomic16_read(Int128 *__return_storage_ptr__,Int128 *ptr)

{
  undefined1 cmp [16];
  Int128 *pIVar1;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  Int128 *ptr_local;
  
  cmp._8_8_ = in_stack_ffffffffffffffb0;
  cmp._0_8_ = in_stack_ffffffffffffffa8;
  pIVar1 = atomic16_cmpxchg(__return_storage_ptr__,(Int128 *)0x0,(Int128)cmp,(Int128)ZEXT816(0));
  return pIVar1;
}

Assistant:

static inline Int128 atomic16_read(Int128 *ptr)
{
    /* Maybe replace 0 with 0, returning the old value.  */
#ifdef _MSC_VER
    Int128 x = int128_make64(0);
    Int128 y = int128_make64(0);
    return atomic16_cmpxchg(ptr, x, y);
#else
    return atomic16_cmpxchg(ptr, 0, 0);
#endif
}